

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O1

void registerPlugins(PluginManager *manager)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"/std/vector","");
  Typelib::Container::registerContainer((string *)local_30,Vector::factory);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"/std/string","");
  Typelib::Container::registerContainer((string *)local_30,String::factory);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void registerPlugins(Typelib::PluginManager& manager)
{
    Typelib::Container::registerContainer("/std/vector", Vector::factory);
    Typelib::Container::registerContainer("/std/string", String::factory);
}